

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.h
# Opt level: O0

option_group_definition * __thiscall
VW::config::option_group_definition::add<unsigned_int>
          (option_group_definition *this,typed_option<unsigned_int> *op)

{
  option_group_definition *in_RDI;
  value_type *in_stack_ffffffffffffff98;
  typed_option<unsigned_int> *in_stack_ffffffffffffffc8;
  
  std::make_shared<VW::config::typed_option<unsigned_int>,VW::config::typed_option<unsigned_int>&>
            (in_stack_ffffffffffffffc8);
  std::shared_ptr<VW::config::base_option>::shared_ptr<VW::config::typed_option<unsigned_int>,void>
            ((shared_ptr<VW::config::base_option> *)in_RDI,
             (shared_ptr<VW::config::typed_option<unsigned_int>_> *)in_stack_ffffffffffffff98);
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::push_back((vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
               *)in_RDI,in_stack_ffffffffffffff98);
  std::shared_ptr<VW::config::base_option>::~shared_ptr
            ((shared_ptr<VW::config::base_option> *)0x13fabf);
  std::shared_ptr<VW::config::typed_option<unsigned_int>_>::~shared_ptr
            ((shared_ptr<VW::config::typed_option<unsigned_int>_> *)0x13fac9);
  return in_RDI;
}

Assistant:

option_group_definition& add(typed_option<T> op)
  {
    m_options.push_back(std::make_shared<typed_option<T>>(op));
    return *this;
  }